

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string *s,uint8_t *ptr)

{
  uint size_00;
  byte *pbVar1;
  LogMessage *pLVar2;
  void *data;
  uint8_t *puVar3;
  uint32_t size;
  uint8_t *ptr_local;
  string *s_local;
  uint32_t num_local;
  EpsCopyOutputStream *this_local;
  byte *local_78;
  uint local_70;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  LogMessageFatal local_48 [23];
  Voidify local_31;
  byte *local_30;
  undefined4 local_28;
  uint32_t local_24;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  pbVar1 = EnsureSpace(this,ptr);
  size_00 = std::__cxx11::string::size();
  local_28 = 2;
  local_30 = pbVar1;
  local_24 = num;
  local_20 = this;
  if (pbVar1 < this->end_) {
    local_18 = pbVar1;
    for (local_c = num << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
      *local_18 = (byte)local_c | 0x80;
      local_18 = local_18 + 1;
    }
    *local_18 = (byte)local_c;
    local_78 = local_18 + 1;
    for (local_70 = size_00; 0x7f < local_70; local_70 = local_70 >> 7) {
      *local_78 = (byte)local_70 | 0x80;
      local_78 = local_78 + 1;
    }
    *local_78 = (byte)local_70;
    local_18 = local_18 + 1;
    data = (void *)std::__cxx11::string::data();
    puVar3 = WriteRaw(this,data,size_00,local_78 + 1);
    return puVar3;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"ptr < end_");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
             ,0x355,local_58._M_len,local_58._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num, const std::string& s,
                                               uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}